

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bellman_ford.h
# Opt level: O1

bool __thiscall
lemon::
BellmanFord<lemon::ReverseDigraph<const_lemon::SmartDigraph>,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_lemon::BellmanFordDefaultTraits<lemon::ReverseDigraph<const_lemon::SmartDigraph>,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
::processNextRound(BellmanFord<lemon::ReverseDigraph<const_lemon::SmartDigraph>,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_lemon::BellmanFordDefaultTraits<lemon::ReverseDigraph<const_lemon::SmartDigraph>,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
                   *this)

{
  ulong *puVar1;
  _Bit_type *p_Var2;
  pointer pdVar3;
  Digraph *pDVar4;
  pointer pNVar5;
  byte bVar6;
  pointer pNVar7;
  iterator iVar8;
  int iVar9;
  pointer pNVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  pointer pNVar14;
  ulong uVar15;
  size_type __n;
  ulong uVar16;
  long lVar17;
  long lVar18;
  double dVar19;
  Node target;
  vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_> nextProcess;
  vector<double,_std::allocator<double>_> values;
  Node local_6c;
  pointer local_68;
  iterator iStack_60;
  pointer local_58;
  vector<double,_std::allocator<double>_> local_48;
  
  pNVar10 = (this->_process).
            super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
            ._M_impl.super__Vector_impl_data._M_start;
  __n = (long)(this->_process).
              super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar10 >> 2;
  uVar11 = (uint)__n;
  if (0 < (int)uVar11) {
    p_Var2 = (this->_mask->super_NodeMap<bool>).
             super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>_>
             .
             super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>
             .super_Map.container.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar16 = 0;
    do {
      iVar9 = pNVar10[uVar16]._id;
      uVar12 = (ulong)iVar9;
      uVar13 = uVar12 + 0x3f;
      if (-1 < (long)uVar12) {
        uVar13 = uVar12;
      }
      bVar6 = (byte)iVar9 & 0x3f;
      puVar1 = p_Var2 + ((long)uVar13 >> 6) +
                        (ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) +
                        0xffffffffffffffff;
      *puVar1 = *puVar1 & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
      uVar16 = uVar16 + 1;
    } while ((uVar11 & 0x7fffffff) != uVar16);
  }
  local_68 = (pointer)0x0;
  iStack_60._M_current = (pointer)0x0;
  local_58 = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector(&local_48,__n,(allocator_type *)&local_6c);
  pNVar10 = (this->_process).
            super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar11 = (uint)((ulong)((long)(this->_process).
                                super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar10) >> 2);
  if (0 < (int)uVar11) {
    pdVar3 = (this->_dist->super_NodeMap<double>).
             super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_double>_>
             .
             super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_double>
             .super_Map.container.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar16 = 0;
    do {
      local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar16] = pdVar3[pNVar10[uVar16]._id];
      uVar16 = uVar16 + 1;
    } while ((uVar11 & 0x7fffffff) != uVar16);
  }
  pNVar10 = (this->_process).
            super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pNVar14 = (this->_process).
            super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)pNVar14 - (long)pNVar10) >> 2)) {
    lVar17 = 0;
    do {
      pDVar4 = this->_gr;
      iVar9 = *(int *)(*(long *)&(((pDVar4->
                                   super_DigraphAdaptorExtender<lemon::ReverseDigraphBase<const_lemon::SmartDigraph>_>
                                   ).super_ReverseDigraphBase<const_lemon::SmartDigraph>.
                                   super_DigraphAdaptorBase<const_lemon::SmartDigraph>._digraph)->
                                 super_ExtendedSmartDigraphBase).super_SmartDigraphBase._nodes +
                      (long)pNVar10[lVar17]._id * 8);
      while (iVar9 != -1) {
        lVar18 = (long)iVar9 * 0x10;
        local_6c._id = *(int *)(*(long *)&(((this->_gr->
                                            super_DigraphAdaptorExtender<lemon::ReverseDigraphBase<const_lemon::SmartDigraph>_>
                                            ).super_ReverseDigraphBase<const_lemon::SmartDigraph>.
                                            super_DigraphAdaptorBase<const_lemon::SmartDigraph>.
                                           _digraph)->super_ExtendedSmartDigraphBase).
                                          super_SmartDigraphBase._arcs.
                                          super__Vector_base<lemon::SmartDigraphBase::ArcT,_std::allocator<lemon::SmartDigraphBase::ArcT>_>
                                          ._M_impl.super__Vector_impl_data + 4 + lVar18);
        dVar19 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar17] +
                 (this->_length->
                 super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_double>_>
                 ).
                 super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_double>
                 .super_Map.container.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar9];
        pdVar3 = (this->_dist->super_NodeMap<double>).
                 super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_double>_>
                 .
                 super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_double>
                 .super_Map.container.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (dVar19 < pdVar3[local_6c._id]) {
          (this->_pred->super_NodeMap<lemon::SmartDigraphBase::Arc>).
          super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>_>
          .
          super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
          .super_Map.values[local_6c._id]._id = iVar9;
          uVar13 = (ulong)local_6c._id;
          pdVar3[uVar13] = dVar19;
          uVar16 = uVar13 + 0x3f;
          if (-1 < (long)uVar13) {
            uVar16 = uVar13;
          }
          p_Var2 = (this->_mask->super_NodeMap<bool>).
                   super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>_>
                   .
                   super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>
                   .super_Map.container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          uVar15 = (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001);
          uVar12 = p_Var2[((long)uVar16 >> 6) + uVar15 + 0xffffffffffffffff];
          if ((uVar12 >> (uVar13 & 0x3f) & 1) == 0) {
            p_Var2[((long)uVar16 >> 6) + uVar15 + 0xffffffffffffffff] =
                 uVar12 | 1L << ((byte)local_6c._id & 0x3f);
            if (iStack_60._M_current == local_58) {
              std::
              vector<lemon::SmartDigraphBase::Node,std::allocator<lemon::SmartDigraphBase::Node>>::
              _M_realloc_insert<lemon::SmartDigraphBase::Node_const&>
                        ((vector<lemon::SmartDigraphBase::Node,std::allocator<lemon::SmartDigraphBase::Node>>
                          *)&local_68,iStack_60,&local_6c);
            }
            else {
              (iStack_60._M_current)->_id = local_6c._id;
              iStack_60._M_current = iStack_60._M_current + 1;
            }
          }
        }
        iVar9 = *(int *)(*(long *)&(((pDVar4->
                                     super_DigraphAdaptorExtender<lemon::ReverseDigraphBase<const_lemon::SmartDigraph>_>
                                     ).super_ReverseDigraphBase<const_lemon::SmartDigraph>.
                                     super_DigraphAdaptorBase<const_lemon::SmartDigraph>._digraph)->
                                   super_ExtendedSmartDigraphBase).super_SmartDigraphBase._arcs.
                                   super__Vector_base<lemon::SmartDigraphBase::ArcT,_std::allocator<lemon::SmartDigraphBase::ArcT>_>
                                   ._M_impl.super__Vector_impl_data + 8 + lVar18);
      }
      lVar17 = lVar17 + 1;
      pNVar10 = (this->_process).
                super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pNVar14 = (this->_process).
                super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while (lVar17 < (int)((ulong)((long)pNVar14 - (long)pNVar10) >> 2));
  }
  iVar8._M_current = (Node *)iStack_60;
  pNVar7 = local_68;
  pNVar5 = (this->_process).
           super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->_process).
  super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>.
  _M_impl.super__Vector_impl_data._M_start = local_68;
  (this->_process).
  super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>.
  _M_impl.super__Vector_impl_data._M_finish = iStack_60._M_current;
  (this->_process).
  super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_58;
  local_68 = pNVar10;
  iStack_60._M_current = pNVar14;
  local_58 = pNVar5;
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68 != (pointer)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  return pNVar7 == iVar8._M_current;
}

Assistant:

bool processNextRound() {
    for (int i = 0; i < int(_process.size()); ++i) {
      _mask->set(_process[i], false);
    }
    std::vector<Node>  nextProcess;
    std::vector<Value> values(_process.size());
    for (int i = 0; i < int(_process.size()); ++i) {
      values[i] = (*_dist)[_process[i]];
    }
    for (int i = 0; i < int(_process.size()); ++i) {
      for (OutArcIt it(*_gr, _process[i]); it != INVALID; ++it) {
        Node  target  = _gr->target(it);
        Value relaxed = OperationTraits::plus(values[i], (*_length)[it]);
        if (OperationTraits::less(relaxed, (*_dist)[target])) {
          _pred->set(target, it);
          _dist->set(target, relaxed);
          if (!(*_mask)[target]) {
            _mask->set(target, true);
            nextProcess.push_back(target);
          }
        }
      }
    }
    _process.swap(nextProcess);
    return _process.empty();
  }